

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::puconversion::assumedBase(unit *start,unit *result)

{
  bool bVar1;
  unit this;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar2;
  precise_unit *in_stack_ffffffffffffffd8;
  
  bVar1 = unit::operator==((unit *)in_stack_ffffffffffffffd8,
                           (unit *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  if ((bVar1) ||
     (bVar1 = unit::operator==((unit *)in_stack_ffffffffffffffd8,
                               (unit *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)
                              ), bVar1)) {
    return 60.0;
  }
  bVar1 = unit::operator==((unit *)in_stack_ffffffffffffffd8,
                           (unit *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  if ((!bVar1) &&
     (bVar1 = unit::operator==((unit *)in_stack_ffffffffffffffd8,
                               (unit *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)
                              ), !bVar1)) {
    unit_cast(in_stack_ffffffffffffffd8);
    bVar1 = unit::operator==((unit *)in_stack_ffffffffffffffd8,
                             (unit *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    uVar2 = true;
    if (!bVar1) {
      this = unit_cast(in_stack_ffffffffffffffd8);
      uVar2 = unit::operator==((unit *)this,(unit *)CONCAT17(uVar2,in_stack_ffffffffffffffd0));
    }
    if ((bool)uVar2 == false) {
      return NAN;
    }
    return 341.25;
  }
  return 100.0;
}

Assistant:

inline double assumedBase(const unit& start, const unit& result)
    {
        if (puHz == result || puHz == start) {  // assume 60 Hz
            return 60.0;
        }
        if (puMW == result || puMW == start) {  // assume 100MVA for power base
            return 100.0;
        }
        // mach number
        if (unit_cast(precise::special::mach) == result ||
            unit_cast(precise::special::mach) ==
                start) {  // assume NASA mach number approximation conversions
            return 341.25;
        }
        return constants::invalid_conversion;
    }